

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::MacroFormalArgumentListSyntax::setChild
          (MacroFormalArgumentListSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  long in_RSI;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *in_RDI;
  Token TVar1;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *this_01;
  pointer local_30;
  Info *local_28;
  SyntaxNode *local_20;
  Info *local_18;
  
  this_01 = (SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)this_01);
    local_20 = TVar1._0_8_;
    (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = local_20;
    local_18 = TVar1.info;
    (in_RDI->super_SyntaxListBase).childCount = (size_t)local_18;
  }
  else if (in_RSI == 1) {
    this_00 = TokenOrSyntax::node((TokenOrSyntax *)0x72ba09);
    SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>>
              (this_00);
    SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::operator=(in_RDI,this_01);
  }
  else {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)this_01);
    local_30 = TVar1._0_8_;
    in_RDI[1].elements._M_ptr = local_30;
    local_28 = TVar1.info;
    in_RDI[1].elements._M_extent._M_extent_value = (size_t)local_28;
  }
  return;
}

Assistant:

void MacroFormalArgumentListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: args = child.node()->as<SeparatedSyntaxList<MacroFormalArgumentSyntax>>(); return;
        case 2: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}